

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandWriteEqn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
      fwrite("Empty network.\n",0xf,1,(FILE *)pAbc->Out);
    }
    else {
      if (globalUtilOptind + 1 != argc) goto LAB_002d44ce;
      Io_Write(pAbc->pNtkCur,argv[globalUtilOptind],IO_FILE_EQN);
    }
    iVar1 = 0;
  }
  else {
LAB_002d44ce:
    fwrite("usage: write_eqn [-h] <file>\n",0x1d,1,(FILE *)pAbc->Err);
    fwrite("\t         writes the current network in the equation format\n",0x3c,1,(FILE *)pAbc->Err
          );
    fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
    fwrite("\tfile   : the name of the file to write\n",0x28,1,(FILE *)pAbc->Err);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int IoCommandWriteEqn( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the corresponding file writer
    Io_Write( pAbc->pNtkCur, pFileName, IO_FILE_EQN );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_eqn [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         writes the current network in the equation format\n" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}